

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O1

string * __thiscall
helics::EmptyCore::query_abi_cxx11_
          (string *__return_storage_ptr__,EmptyCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes param_3)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t __n;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  size_t __n_00;
  char *__s1;
  size_type __rlen;
  size_type __rlen_2;
  size_type __dnew_1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __s1 = queryStr._M_str;
  __n_00 = queryStr._M_len;
  __n = target._M_len;
  if ((__n == 4) && (iVar2 = bcmp(target._M_str,"core",4), iVar2 == 0)) {
LAB_00391d79:
    lVar1 = __n_00 - 4;
    switch(lVar1) {
    case 0:
switchD_00391d95_caseD_0:
      iVar2 = bcmp(__s1,"name",__n_00);
      if (iVar2 == 0) goto LAB_00391fc1;
      if (__n_00 == 6) {
switchD_00391edb_caseD_2:
        iVar2 = bcmp(__s1,"exists",__n_00);
        if (iVar2 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          *(undefined4 *)&__return_storage_ptr__->field_2 = 0x65757274;
          __return_storage_ptr__->_M_string_length = 4;
          (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
          return __return_storage_ptr__;
        }
        if (__n_00 == 7) goto switchD_00391e77_caseD_3;
      }
      else {
        if (__n_00 == 7) goto switchD_00391e77_caseD_3;
        if (__n_00 == 10) goto switchD_00391d95_caseD_6;
      }
      break;
    case 2:
switchD_00391d95_caseD_2:
      iVar2 = bcmp(__s1,"isinit",__n_00);
      if (iVar2 == 0) {
LAB_00392017:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        *(undefined4 *)&__return_storage_ptr__->field_2 = 0x736c6166;
        *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x65;
        __return_storage_ptr__->_M_string_length = 5;
        return __return_storage_ptr__;
      }
      switch(lVar1) {
      case 0:
        goto switchD_00391d95_caseD_0;
      case 2:
        goto switchD_00391edb_caseD_2;
      case 3:
        goto switchD_00391e77_caseD_3;
      case 6:
        goto switchD_00391d95_caseD_6;
      }
      break;
    case 3:
      iVar2 = bcmp(__s1,"queries",__n_00);
      if (iVar2 == 0) goto LAB_00392038;
      switch(lVar1) {
      case 0:
        goto switchD_00391d95_caseD_0;
      case 2:
        goto switchD_00391d95_caseD_2;
      case 3:
        goto switchD_00391e77_caseD_3;
      case 6:
        goto switchD_00391d95_caseD_6;
      case 7:
        goto switchD_00391d95_caseD_7;
      case 0xd:
        goto switchD_00391d95_caseD_d;
      }
      break;
    case 6:
switchD_00391d95_caseD_6:
      iVar2 = bcmp(__s1,"identifier",__n_00);
      if (iVar2 != 0) {
        if (__n_00 == 7) {
switchD_00391e77_caseD_3:
          iVar2 = bcmp(__s1,"version",__n_00);
          if (iVar2 == 0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            local_50.field_2._M_allocated_capacity._0_2_ = 0x22;
            local_50._M_string_length = 1;
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"3.6.1 (2025-02-24)");
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar4->_M_dataplus)._M_p;
            paVar5 = &pbVar4->field_2;
            if (paVar6 == paVar5) {
              local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            }
            else {
              local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_70._M_dataplus._M_p = (pointer)paVar6;
            }
            local_70._M_string_length = pbVar4->_M_string_length;
            (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
            pbVar4->_M_string_length = 0;
            (pbVar4->field_2)._M_local_buf[0] = '\0';
            pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_replace_aux(&local_70,local_70._M_string_length,0,1,'\"');
            goto LAB_00392169;
          }
        }
        else if (__n_00 == 6) goto switchD_00391edb_caseD_2;
        break;
      }
LAB_00391fc1:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_50._M_string_length = 1;
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50,"null");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if (paVar6 == paVar5) {
        local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_70._M_dataplus._M_p = (pointer)paVar6;
      }
      local_70._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_replace_aux(&local_70,local_70._M_string_length,0,1,'\"');
LAB_00392169:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar6) {
        uVar7 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        (ulong)(local_70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return __return_storage_ptr__;
      }
      uVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                          local_50.field_2._M_allocated_capacity._0_2_);
      _Var8._M_p = local_50._M_dataplus._M_p;
      goto LAB_00391fa7;
    case 7:
switchD_00391d95_caseD_7:
      iVar2 = bcmp(__s1,"isconnected",__n_00);
      if (iVar2 == 0) goto LAB_00392017;
      switch(lVar1) {
      case 0:
        goto switchD_00391d95_caseD_0;
      case 2:
        goto switchD_00391d95_caseD_2;
      case 3:
        goto switchD_00391e77_caseD_3;
      case 6:
        goto switchD_00391d95_caseD_6;
      }
      break;
    case 0xd:
switchD_00391d95_caseD_d:
      iVar2 = bcmp(__s1,"available_queries",__n_00);
      if (iVar2 == 0) {
LAB_00392038:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        local_70._M_dataplus._M_p = (pointer)0x168;
        pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_create(__return_storage_ptr__,(size_type *)&local_70,0);
        _Var8._M_p = local_70._M_dataplus._M_p;
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             (size_type)local_70._M_dataplus._M_p;
        memcpy(pcVar3,
               "[\"isinit\",\"isconnected\",\"exists\",\"name\",\"identifier\",\"address\",\"queries\",\"address\",\"federates\",\"inputs\",\"endpoints\",\"filtered_endpoints\",\"publications\",\"filters\",\"tags\",\"version\",\"version_all\",\"federate_map\",\"dependency_graph\",\"data_flow_graph\",\"dependencies\",\"dependson\",\"dependents\",\"current_time\",\"global_time\",\"global_state\",\"global_flush\",\"current_state\"]"
               ,0x168);
        __return_storage_ptr__->_M_string_length = (size_type)_Var8._M_p;
        pcVar3[_Var8._M_p] = '\0';
        return __return_storage_ptr__;
      }
      switch(lVar1) {
      case 0:
        goto switchD_00391d95_caseD_0;
      case 2:
        goto switchD_00391d95_caseD_2;
      case 3:
        goto switchD_00391e77_caseD_3;
      case 6:
        goto switchD_00391d95_caseD_6;
      case 7:
        goto switchD_00391d95_caseD_7;
      }
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50._M_dataplus._M_p = (pointer)0x14;
    local_70._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_70,(size_type *)&local_50,0);
    local_70.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
    *(undefined8 *)local_70._M_dataplus._M_p = 0x2073692065726f43;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 8) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0xb) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0xc) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0xd) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0xe) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0xf) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0x10) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0x11) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0x12) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p + 0x13) = 'd';
    local_70._M_string_length = (size_type)local_50._M_dataplus._M_p;
    local_70._M_dataplus._M_p[local_50._M_dataplus._M_p] = '\0';
    generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_70);
  }
  else {
    iVar2 = (*(this->super_Core)._vptr_Core[0xc])(this);
    if (((undefined8 *)CONCAT44(extraout_var,iVar2))[1] == __n) {
      if ((__n != 0) &&
         (iVar2 = bcmp(target._M_str,*(void **)CONCAT44(extraout_var,iVar2),__n), iVar2 != 0))
      goto LAB_00391dd9;
      goto LAB_00391d79;
    }
    if (__n == 0) goto LAB_00391d79;
LAB_00391dd9:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Federate is disconnected","");
    generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,&local_70);
  }
  uVar7 = local_70.field_2._M_allocated_capacity;
  _Var8._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00391fa7:
    operator_delete(_Var8._M_p,(ulong)(uVar7 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EmptyCore::query(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes /*mode*/)
{
    if (target == "core" || target == getIdentifier() || target.empty()) {
        return quickCoreQueries(queryStr);
    }
    return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Federate is disconnected");
}